

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

double google::protobuf::io::Tokenizer::ParseFloat(string *text)

{
  bool bVar1;
  char *in_RCX;
  string_view str;
  string_view src;
  double result;
  LogMessage LStack_48;
  double local_38;
  string local_30;
  
  local_38 = 0.0;
  bVar1 = TryParseFloat(text,&local_38);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&LStack_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x3f9);
    str._M_str = 
    " Tokenizer::ParseFloat() passed text that could not have been tokenized as a float: ";
    str._M_len = 0x54;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_48,str)
    ;
    src._M_str = in_RCX;
    src._M_len = (size_t)(text->_M_dataplus)._M_p;
    absl::lts_20250127::CEscape_abi_cxx11_(&local_30,(lts_20250127 *)text->_M_string_length,src);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_48,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&LStack_48);
  }
  return local_38;
}

Assistant:

double Tokenizer::ParseFloat(const std::string& text) {
  double result = 0;
  if (!TryParseFloat(text, &result)) {
    ABSL_DLOG(FATAL)
        << " Tokenizer::ParseFloat() passed text that could not have been"
           " tokenized as a float: "
        << absl::CEscape(text);
  }
  return result;
}